

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler_tests.cpp
# Opt level: O2

void scheduler_tests::microTask
               (CScheduler *s,mutex *mutex,int *counter,int delta,time_point rescheduleTime)

{
  long lVar1;
  lock_guard<std::mutex> lock;
  long in_FS_OFFSET;
  Function in_stack_ffffffffffffff58;
  _Bind<void_(*(std::reference_wrapper<CScheduler>,_std::reference_wrapper<std::mutex>,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>))(CScheduler_&,_std::mutex_&,_int_&,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)>
  local_80;
  Function f;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::mutex::lock(mutex);
  *counter = *counter + delta;
  pthread_mutex_unlock((pthread_mutex_t *)mutex);
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_std::reference_wrapper<CScheduler>,_std::reference_wrapper<std::mutex>,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  .
  super__Tuple_impl<1UL,_std::reference_wrapper<std::mutex>,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  .
  super__Tuple_impl<3UL,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  .super__Head_base<3UL,_int,_false>._M_head_impl = 1 - delta;
  local_80._M_f = microTask;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_std::reference_wrapper<CScheduler>,_std::reference_wrapper<std::mutex>,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  .
  super__Tuple_impl<1UL,_std::reference_wrapper<std::mutex>,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  .
  super__Tuple_impl<3UL,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  .
  super__Tuple_impl<4UL,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  .
  super__Head_base<4UL,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_false>
  ._M_head_impl.__d.__r =
       (_Head_base<4UL,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_false>
        )(time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>)
         0x8000000000000000;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_std::reference_wrapper<CScheduler>,_std::reference_wrapper<std::mutex>,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  .
  super__Tuple_impl<1UL,_std::reference_wrapper<std::mutex>,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  .super__Head_base<2UL,_std::reference_wrapper<int>,_false>._M_head_impl._M_data =
       (reference_wrapper<int>)(reference_wrapper<int>)counter;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_std::reference_wrapper<CScheduler>,_std::reference_wrapper<std::mutex>,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  .
  super__Tuple_impl<1UL,_std::reference_wrapper<std::mutex>,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  .super__Head_base<1UL,_std::reference_wrapper<std::mutex>,_false>._M_head_impl._M_data =
       (reference_wrapper<std::mutex>)(reference_wrapper<std::mutex>)mutex;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_std::reference_wrapper<CScheduler>,_std::reference_wrapper<std::mutex>,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  .super__Head_base<0UL,_std::reference_wrapper<CScheduler>,_false>._M_head_impl._M_data =
       (reference_wrapper<CScheduler>)(reference_wrapper<CScheduler>)s;
  std::function<void()>::
  function<std::_Bind<void(*(std::reference_wrapper<CScheduler>,std::reference_wrapper<std::mutex>,std::reference_wrapper<int>,int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>))(CScheduler&,std::mutex&,int&,int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>)>,void>
            ((function<void()> *)&f,&local_80);
  std::function<void_()>::function((function<void_()> *)&stack0xffffffffffffff60,&f);
  CScheduler::schedule(s,in_stack_ffffffffffffff58,(time_point)&stack0xffffffffffffff60);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff60);
  std::_Function_base::~_Function_base(&f.super__Function_base);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void microTask(CScheduler& s, std::mutex& mutex, int& counter, int delta, std::chrono::steady_clock::time_point rescheduleTime)
{
    {
        std::lock_guard<std::mutex> lock(mutex);
        counter += delta;
    }
    auto noTime = std::chrono::steady_clock::time_point::min();
    if (rescheduleTime != noTime) {
        CScheduler::Function f = std::bind(&microTask, std::ref(s), std::ref(mutex), std::ref(counter), -delta + 1, noTime);
        s.schedule(f, rescheduleTime);
    }
}